

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fftpack.c
# Opt level: O1

int r1f5kf_(int *ido,int *l1,double *cc,int *in1,double *ch,int *in2,double *wa1,double *wa2,
           double *wa3,double *wa4)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  double *pdVar8;
  long lVar9;
  double *pdVar10;
  ulong uVar11;
  double *pdVar12;
  int iVar13;
  int iVar14;
  long lVar15;
  long lVar16;
  double *pdVar17;
  long lVar18;
  double *pdVar19;
  int iVar20;
  long lVar21;
  long lVar22;
  long lVar23;
  double *pdVar24;
  double *local_1c0;
  double *local_1b8;
  double *local_1b0;
  double *local_1a8;
  double *local_1a0;
  double *local_188;
  double *local_168;
  double *local_160;
  double *local_158;
  double *local_150;
  double *local_148;
  double *local_140;
  double *local_138;
  double *local_130;
  double *local_128;
  double *local_120;
  double *local_118;
  double *local_110;
  double *local_108;
  double *local_100;
  double *local_f8;
  double *local_f0;
  double *local_e8;
  double *local_e0;
  double *local_d8;
  double *local_d0;
  double *local_c8;
  double *local_c0;
  double *local_b8;
  double *local_b0;
  double *local_a8;
  double *local_a0;
  double *local_98;
  double *local_90;
  double *local_88;
  
  lVar16 = (long)*in1;
  iVar1 = *ido;
  lVar7 = (long)iVar1;
  iVar2 = *l1;
  lVar15 = (long)iVar2;
  uVar3 = iVar2 + 1;
  iVar4 = ~(uVar3 * iVar1) * *in1 + -1;
  iVar13 = *in2;
  lVar9 = (long)iVar13;
  lVar5 = (long)(~(iVar1 * 6) * iVar13 + -1);
  if (0 < lVar15) {
    pdVar19 = ch + lVar5 + 1;
    iVar13 = iVar1 * iVar13;
    iVar20 = iVar13 * 10;
    iVar14 = iVar13 * 8;
    pdVar12 = cc + (((ulong)(uint)(iVar2 * 3) + 1) * lVar7 + 1) * lVar16 + 1;
    lVar6 = lVar7 * lVar16;
    pdVar10 = cc + (((long)(iVar2 * 4) + 1) * lVar7 + 1) * lVar16 + 1;
    pdVar17 = cc + (((long)(iVar2 * 2) + 1) * lVar7 + 1) * lVar16 + 1;
    pdVar8 = cc + (((ulong)(uint)(iVar2 * 5) + 1) * lVar7 + 1) * lVar16 + 1;
    pdVar24 = cc + ((lVar15 + 1) * lVar7 + 1) * lVar16 + 1;
    lVar23 = (ulong)uVar3 - 1;
    do {
      pdVar19[(lVar7 * 6 + 1) * lVar9] =
           pdVar10[iVar4] + pdVar12[iVar4] + pdVar8[iVar4] + pdVar17[iVar4] + pdVar24[iVar4];
      ch[lVar5 + (long)iVar14 + 1] =
           (pdVar10[iVar4] + pdVar12[iVar4]) * -0.8090169943749473 +
           (pdVar8[iVar4] + pdVar17[iVar4]) * 0.30901699437494745 + pdVar24[iVar4];
      pdVar19[(lVar7 * 8 + 1) * lVar9] =
           (pdVar8[iVar4] - pdVar17[iVar4]) * 0.9510565162951535 +
           (pdVar10[iVar4] - pdVar12[iVar4]) * 0.5877852522924732;
      ch[lVar5 + (long)iVar20 + 1] =
           (pdVar10[iVar4] + pdVar12[iVar4]) * 0.30901699437494745 +
           (pdVar8[iVar4] + pdVar17[iVar4]) * -0.8090169943749473 + pdVar24[iVar4];
      pdVar19[(lVar7 * 10 + 1) * lVar9] =
           (pdVar8[iVar4] - pdVar17[iVar4]) * 0.5877852522924732 +
           (pdVar10[iVar4] - pdVar12[iVar4]) * -0.9510565162951535;
      iVar20 = iVar20 + iVar13 * 5;
      iVar14 = iVar14 + iVar13 * 5;
      pdVar19 = pdVar19 + lVar7 * lVar9 * 5;
      pdVar12 = pdVar12 + lVar6;
      pdVar10 = pdVar10 + lVar6;
      pdVar17 = pdVar17 + lVar6;
      pdVar8 = pdVar8 + lVar6;
      pdVar24 = pdVar24 + lVar6;
      lVar23 = lVar23 + -1;
    } while (lVar23 != 0);
  }
  if (0 < iVar2 && iVar1 != 1) {
    lVar21 = (long)(iVar1 + 2);
    lVar22 = (lVar15 + 1) * lVar7;
    local_d0 = cc + (lVar22 + 3) * lVar16 + 1;
    lVar6 = ((long)(iVar2 * 4) + 1) * lVar7;
    local_d8 = cc + (lVar6 + 3) * lVar16 + 1;
    lVar15 = ((ulong)(uint)(iVar2 * 3) + 1) * lVar7;
    local_e0 = cc + (lVar15 + 3) * lVar16 + 1;
    lVar23 = ((ulong)(uint)(iVar2 * 5) + 1) * lVar7;
    local_e8 = cc + (lVar23 + 3) * lVar16 + 1;
    lVar18 = ((long)(iVar2 * 2) + 1) * lVar7;
    local_f0 = cc + (lVar18 + 3) * lVar16 + 1;
    local_f8 = cc + (lVar22 + 2) * lVar16 + 1;
    local_100 = cc + (lVar18 + 2) * lVar16 + 1;
    local_108 = cc + (lVar23 + 2) * lVar16 + 1;
    local_110 = cc + (lVar15 + 2) * lVar16 + 1;
    local_118 = cc + (lVar6 + 2) * lVar16 + 1;
    local_120 = ch + (lVar7 * 7 + lVar21 + -4) * lVar9 + 1;
    local_128 = ch + (lVar21 + lVar7 * 9 + -4) * lVar9 + 1;
    local_130 = ch + (lVar7 * 7 + lVar21 + -3) * lVar9 + 1;
    local_138 = ch + (lVar21 + lVar7 * 9 + -3) * lVar9 + 1;
    local_140 = ch + (lVar7 * 10 + 3) * lVar9 + 1;
    local_148 = ch + (lVar7 * 8 + 3) * lVar9 + 1;
    local_150 = ch + (lVar7 * 6 + 3) * lVar9 + 1;
    local_158 = ch + (lVar7 * 6 + 2) * lVar9 + 1;
    local_160 = ch + (lVar7 * 8 + 2) * lVar9 + 1;
    local_168 = ch + (lVar7 * 10 + 2) * lVar9 + 1;
    lVar15 = lVar7 * lVar9;
    lVar6 = lVar7 * lVar16;
    uVar11 = 1;
    do {
      if (2 < iVar1) {
        lVar23 = 3;
        local_1a0 = local_168;
        local_c8 = local_160;
        local_1a8 = local_118;
        local_1b0 = local_110;
        local_188 = local_f8;
        local_1c0 = local_e0;
        local_88 = local_d8;
        local_1b8 = local_d0;
        local_90 = local_150;
        local_98 = local_148;
        local_a0 = local_140;
        local_a8 = local_138;
        local_b0 = local_130;
        local_b8 = local_128;
        local_c0 = local_120;
        pdVar8 = local_100;
        pdVar10 = local_e8;
        pdVar12 = local_f0;
        pdVar17 = local_158;
        pdVar19 = local_108;
        do {
          pdVar17[lVar5] =
               wa3[lVar23 + -3] * local_1a8[iVar4] + wa3[lVar23 + -2] * local_88[iVar4] +
               wa2[lVar23 + -3] * local_1b0[iVar4] + wa2[lVar23 + -2] * local_1c0[iVar4] +
               wa4[lVar23 + -3] * pdVar19[iVar4] + wa4[lVar23 + -2] * pdVar10[iVar4] +
               wa1[lVar23 + -3] * pdVar8[iVar4] + wa1[lVar23 + -2] * pdVar12[iVar4] +
               local_188[iVar4];
          local_90[lVar5] =
               (wa3[lVar23 + -3] * local_88[iVar4] - local_1a8[iVar4] * wa3[lVar23 + -2]) +
               (wa2[lVar23 + -3] * local_1c0[iVar4] - local_1b0[iVar4] * wa2[lVar23 + -2]) +
               (wa4[lVar23 + -3] * pdVar10[iVar4] - pdVar19[iVar4] * wa4[lVar23 + -2]) +
               (wa1[lVar23 + -3] * pdVar12[iVar4] - pdVar8[iVar4] * wa1[lVar23 + -2]) +
               local_1b8[iVar4];
          local_c8[lVar5] =
               ((wa2[lVar23 + -3] * local_1c0[iVar4] - local_1b0[iVar4] * wa2[lVar23 + -2]) -
               (wa3[lVar23 + -3] * local_88[iVar4] - local_1a8[iVar4] * wa3[lVar23 + -2])) *
               0.5877852522924732 +
               ((wa1[lVar23 + -3] * pdVar12[iVar4] - pdVar8[iVar4] * wa1[lVar23 + -2]) -
               (wa4[lVar23 + -3] * pdVar10[iVar4] - pdVar19[iVar4] * wa4[lVar23 + -2])) *
               0.9510565162951535 +
               (wa3[lVar23 + -2] * local_88[iVar4] +
               wa3[lVar23 + -3] * local_1a8[iVar4] +
               wa2[lVar23 + -3] * local_1b0[iVar4] + wa2[lVar23 + -2] * local_1c0[iVar4]) *
               -0.8090169943749473 +
               (wa4[lVar23 + -2] * pdVar10[iVar4] +
               wa4[lVar23 + -3] * pdVar19[iVar4] +
               wa1[lVar23 + -3] * pdVar8[iVar4] + wa1[lVar23 + -2] * pdVar12[iVar4]) *
               0.30901699437494745 + local_188[iVar4];
          local_c0[lVar5] =
               ((wa3[lVar23 + -2] * local_88[iVar4] +
                wa3[lVar23 + -3] * local_1a8[iVar4] +
                wa2[lVar23 + -3] * local_1b0[iVar4] + wa2[lVar23 + -2] * local_1c0[iVar4]) *
                -0.8090169943749473 +
               (wa4[lVar23 + -2] * pdVar10[iVar4] +
               wa4[lVar23 + -3] * pdVar19[iVar4] +
               wa1[lVar23 + -3] * pdVar8[iVar4] + wa1[lVar23 + -2] * pdVar12[iVar4]) *
               0.30901699437494745 + local_188[iVar4]) -
               (((wa1[lVar23 + -3] * pdVar12[iVar4] - pdVar8[iVar4] * wa1[lVar23 + -2]) -
                (wa4[lVar23 + -3] * pdVar10[iVar4] - pdVar19[iVar4] * wa4[lVar23 + -2])) *
                0.9510565162951535 +
               ((wa2[lVar23 + -3] * local_1c0[iVar4] - local_1b0[iVar4] * wa2[lVar23 + -2]) -
               (wa3[lVar23 + -3] * local_88[iVar4] - local_1a8[iVar4] * wa3[lVar23 + -2])) *
               0.5877852522924732);
          local_98[lVar5] =
               ((wa4[lVar23 + -3] * pdVar19[iVar4] + pdVar10[iVar4] * wa4[lVar23 + -2]) -
               (wa1[lVar23 + -3] * pdVar8[iVar4] + pdVar12[iVar4] * wa1[lVar23 + -2])) *
               0.9510565162951535 +
               ((wa3[lVar23 + -3] * local_1a8[iVar4] + local_88[iVar4] * wa3[lVar23 + -2]) -
               (wa2[lVar23 + -3] * local_1b0[iVar4] + local_1c0[iVar4] * wa2[lVar23 + -2])) *
               0.5877852522924732 +
               ((wa3[lVar23 + -3] * local_88[iVar4] - local_1a8[iVar4] * wa3[lVar23 + -2]) +
               (wa2[lVar23 + -3] * local_1c0[iVar4] - local_1b0[iVar4] * wa2[lVar23 + -2])) *
               -0.8090169943749473 +
               ((wa4[lVar23 + -3] * pdVar10[iVar4] - pdVar19[iVar4] * wa4[lVar23 + -2]) +
               (wa1[lVar23 + -3] * pdVar12[iVar4] - pdVar8[iVar4] * wa1[lVar23 + -2])) *
               0.30901699437494745 + local_1b8[iVar4];
          local_b0[lVar5] =
               (((wa4[lVar23 + -3] * pdVar19[iVar4] + wa4[lVar23 + -2] * pdVar10[iVar4]) -
                (wa1[lVar23 + -3] * pdVar8[iVar4] + wa1[lVar23 + -2] * pdVar12[iVar4])) *
                0.9510565162951535 +
               ((wa3[lVar23 + -3] * local_1a8[iVar4] + wa3[lVar23 + -2] * local_88[iVar4]) -
               (wa2[lVar23 + -3] * local_1b0[iVar4] + wa2[lVar23 + -2] * local_1c0[iVar4])) *
               0.5877852522924732) -
               (((wa3[lVar23 + -3] * local_88[iVar4] - local_1a8[iVar4] * wa3[lVar23 + -2]) +
                (wa2[lVar23 + -3] * local_1c0[iVar4] - local_1b0[iVar4] * wa2[lVar23 + -2])) *
                -0.8090169943749473 +
               ((wa4[lVar23 + -3] * pdVar10[iVar4] - pdVar19[iVar4] * wa4[lVar23 + -2]) +
               (wa1[lVar23 + -3] * pdVar12[iVar4] - pdVar8[iVar4] * wa1[lVar23 + -2])) *
               0.30901699437494745 + local_1b8[iVar4]);
          local_1a0[lVar5] =
               ((wa1[lVar23 + -3] * pdVar12[iVar4] - pdVar8[iVar4] * wa1[lVar23 + -2]) -
               (wa4[lVar23 + -3] * pdVar10[iVar4] - pdVar19[iVar4] * wa4[lVar23 + -2])) *
               0.5877852522924732 +
               ((wa2[lVar23 + -3] * local_1c0[iVar4] - local_1b0[iVar4] * wa2[lVar23 + -2]) -
               (wa3[lVar23 + -3] * local_88[iVar4] - local_1a8[iVar4] * wa3[lVar23 + -2])) *
               -0.9510565162951535 +
               (wa3[lVar23 + -3] * local_1a8[iVar4] + wa3[lVar23 + -2] * local_88[iVar4] +
               wa2[lVar23 + -3] * local_1b0[iVar4] + wa2[lVar23 + -2] * local_1c0[iVar4]) *
               0.30901699437494745 +
               (wa4[lVar23 + -3] * pdVar19[iVar4] + wa4[lVar23 + -2] * pdVar10[iVar4] +
               wa1[lVar23 + -3] * pdVar8[iVar4] + wa1[lVar23 + -2] * pdVar12[iVar4]) *
               -0.8090169943749473 + local_188[iVar4];
          local_b8[lVar5] =
               ((wa3[lVar23 + -3] * local_1a8[iVar4] + wa3[lVar23 + -2] * local_88[iVar4] +
                wa2[lVar23 + -3] * local_1b0[iVar4] + wa2[lVar23 + -2] * local_1c0[iVar4]) *
                0.30901699437494745 +
               (wa4[lVar23 + -3] * pdVar19[iVar4] + wa4[lVar23 + -2] * pdVar10[iVar4] +
               wa1[lVar23 + -3] * pdVar8[iVar4] + wa1[lVar23 + -2] * pdVar12[iVar4]) *
               -0.8090169943749473 + local_188[iVar4]) -
               (((wa1[lVar23 + -3] * pdVar12[iVar4] - pdVar8[iVar4] * wa1[lVar23 + -2]) -
                (wa4[lVar23 + -3] * pdVar10[iVar4] - pdVar19[iVar4] * wa4[lVar23 + -2])) *
                0.5877852522924732 +
               ((wa2[lVar23 + -3] * local_1c0[iVar4] - local_1b0[iVar4] * wa2[lVar23 + -2]) -
               (wa3[lVar23 + -3] * local_88[iVar4] - local_1a8[iVar4] * wa3[lVar23 + -2])) *
               -0.9510565162951535);
          local_a0[lVar5] =
               ((wa4[lVar23 + -3] * pdVar19[iVar4] + pdVar10[iVar4] * wa4[lVar23 + -2]) -
               (wa1[lVar23 + -3] * pdVar8[iVar4] + pdVar12[iVar4] * wa1[lVar23 + -2])) *
               0.5877852522924732 +
               ((wa3[lVar23 + -3] * local_1a8[iVar4] + local_88[iVar4] * wa3[lVar23 + -2]) -
               (wa2[lVar23 + -3] * local_1b0[iVar4] + local_1c0[iVar4] * wa2[lVar23 + -2])) *
               -0.9510565162951535 +
               ((wa3[lVar23 + -3] * local_88[iVar4] - local_1a8[iVar4] * wa3[lVar23 + -2]) +
               (wa2[lVar23 + -3] * local_1c0[iVar4] - local_1b0[iVar4] * wa2[lVar23 + -2])) *
               0.30901699437494745 +
               ((wa4[lVar23 + -3] * pdVar10[iVar4] - pdVar19[iVar4] * wa4[lVar23 + -2]) +
               (wa1[lVar23 + -3] * pdVar12[iVar4] - pdVar8[iVar4] * wa1[lVar23 + -2])) *
               -0.8090169943749473 + local_1b8[iVar4];
          local_a8[lVar5] =
               (((wa4[lVar23 + -3] * pdVar19[iVar4] + wa4[lVar23 + -2] * pdVar10[iVar4]) -
                (wa1[lVar23 + -3] * pdVar8[iVar4] + wa1[lVar23 + -2] * pdVar12[iVar4])) *
                0.5877852522924732 +
               ((wa3[lVar23 + -3] * local_1a8[iVar4] + wa3[lVar23 + -2] * local_88[iVar4]) -
               (wa2[lVar23 + -3] * local_1b0[iVar4] + wa2[lVar23 + -2] * local_1c0[iVar4])) *
               -0.9510565162951535) -
               (((wa3[lVar23 + -3] * local_88[iVar4] - local_1a8[iVar4] * wa3[lVar23 + -2]) +
                (wa2[lVar23 + -3] * local_1c0[iVar4] - local_1b0[iVar4] * wa2[lVar23 + -2])) *
                0.30901699437494745 +
               ((wa4[lVar23 + -3] * pdVar10[iVar4] - pdVar19[iVar4] * wa4[lVar23 + -2]) +
               (wa1[lVar23 + -3] * pdVar12[iVar4] - pdVar8[iVar4] * wa1[lVar23 + -2])) *
               -0.8090169943749473 + local_1b8[iVar4]);
          local_c0 = local_c0 + lVar9 * -2;
          local_b8 = local_b8 + lVar9 * -2;
          local_b0 = local_b0 + lVar9 * -2;
          local_a0 = local_a0 + lVar9 * 2;
          local_98 = local_98 + lVar9 * 2;
          lVar23 = lVar23 + 2;
          local_90 = local_90 + lVar9 * 2;
          local_88 = local_88 + lVar16 * 2;
          local_1c0 = local_1c0 + lVar16 * 2;
          pdVar10 = pdVar10 + lVar16 * 2;
          pdVar12 = pdVar12 + lVar16 * 2;
          local_188 = local_188 + lVar16 * 2;
          pdVar8 = pdVar8 + lVar16 * 2;
          local_1b8 = local_1b8 + lVar16 * 2;
          pdVar19 = pdVar19 + lVar16 * 2;
          local_1b0 = local_1b0 + lVar16 * 2;
          local_1a8 = local_1a8 + lVar16 * 2;
          local_a8 = local_a8 + lVar9 * -2;
          pdVar17 = pdVar17 + lVar9 * 2;
          local_c8 = local_c8 + lVar9 * 2;
          local_1a0 = local_1a0 + lVar9 * 2;
        } while (lVar23 <= lVar7);
      }
      uVar11 = uVar11 + 1;
      local_120 = local_120 + lVar15 * 5;
      local_128 = local_128 + lVar15 * 5;
      local_130 = local_130 + lVar15 * 5;
      local_138 = local_138 + lVar15 * 5;
      local_140 = local_140 + lVar15 * 5;
      local_148 = local_148 + lVar15 * 5;
      local_150 = local_150 + lVar15 * 5;
      local_d0 = local_d0 + lVar6;
      local_d8 = local_d8 + lVar6;
      local_e0 = local_e0 + lVar6;
      local_e8 = local_e8 + lVar6;
      local_f0 = local_f0 + lVar6;
      local_f8 = local_f8 + lVar6;
      local_100 = local_100 + lVar6;
      local_108 = local_108 + lVar6;
      local_110 = local_110 + lVar6;
      local_118 = local_118 + lVar6;
      local_158 = local_158 + lVar15 * 5;
      local_160 = local_160 + lVar15 * 5;
      local_168 = local_168 + lVar15 * 5;
    } while (uVar11 != uVar3);
  }
  return 0;
}

Assistant:

int r1f5kf_(int *ido, int *l1, fft_real_t *cc, int *
	in1, fft_real_t *ch, int *in2, fft_real_t *wa1, fft_real_t *wa2, fft_real_t *wa3, fft_real_t *
	wa4)
{
    /* System generated locals */
    int cc_dim1, cc_dim2, cc_dim3, cc_offset, ch_dim1, ch_dim2, ch_offset,
	     i__1, i__2;

    /* Builtin functions */

    /* Local variables */
     int i__, k, ic;
     fft_real_t arg, ti11, ti12, tr11, tr12;
     int idp2;


    /* Parameter adjustments */
    --wa4;
    --wa3;
    --wa2;
    --wa1;
    cc_dim1 = *in1;
    cc_dim2 = *ido;
    cc_dim3 = *l1;
    cc_offset = 1 + cc_dim1 * (1 + cc_dim2 * (1 + cc_dim3));
    cc -= cc_offset;
    ch_dim1 = *in2;
    ch_dim2 = *ido;
    ch_offset = 1 + ch_dim1 * (1 + ch_dim2 * 6);
    ch -= ch_offset;

    /* Function Body */
    arg = atan(1.0) * 8.0 / 5.0;
    tr11 = cos(arg);
    ti11 = sin(arg);
    tr12 = cos(arg * 2.0);
    ti12 = sin(arg * 2.0);
    i__1 = *l1;
    for (k = 1; k <= i__1; ++k) {
	ch[((k * 5 + 1) * ch_dim2 + 1) * ch_dim1 + 1] = cc[((k + cc_dim3) *
		cc_dim2 + 1) * cc_dim1 + 1] + (cc[((k + cc_dim3 * 5) *
		cc_dim2 + 1) * cc_dim1 + 1] + cc[((k + (cc_dim3 << 1)) *
		cc_dim2 + 1) * cc_dim1 + 1]) + (cc[((k + (cc_dim3 << 2)) *
		cc_dim2 + 1) * cc_dim1 + 1] + cc[((k + cc_dim3 * 3) * cc_dim2
		+ 1) * cc_dim1 + 1]);
	ch[(*ido + (k * 5 + 2) * ch_dim2) * ch_dim1 + 1] = cc[((k + cc_dim3) *
		 cc_dim2 + 1) * cc_dim1 + 1] + tr11 * (cc[((k + cc_dim3 * 5) *
		 cc_dim2 + 1) * cc_dim1 + 1] + cc[((k + (cc_dim3 << 1)) *
		cc_dim2 + 1) * cc_dim1 + 1]) + tr12 * (cc[((k + (cc_dim3 << 2)
		) * cc_dim2 + 1) * cc_dim1 + 1] + cc[((k + cc_dim3 * 3) *
		cc_dim2 + 1) * cc_dim1 + 1]);
	ch[((k * 5 + 3) * ch_dim2 + 1) * ch_dim1 + 1] = ti11 * (cc[((k +
		cc_dim3 * 5) * cc_dim2 + 1) * cc_dim1 + 1] - cc[((k + (
		cc_dim3 << 1)) * cc_dim2 + 1) * cc_dim1 + 1]) + ti12 * (cc[((
		k + (cc_dim3 << 2)) * cc_dim2 + 1) * cc_dim1 + 1] - cc[((k +
		cc_dim3 * 3) * cc_dim2 + 1) * cc_dim1 + 1]);
	ch[(*ido + (k * 5 + 4) * ch_dim2) * ch_dim1 + 1] = cc[((k + cc_dim3) *
		 cc_dim2 + 1) * cc_dim1 + 1] + tr12 * (cc[((k + cc_dim3 * 5) *
		 cc_dim2 + 1) * cc_dim1 + 1] + cc[((k + (cc_dim3 << 1)) *
		cc_dim2 + 1) * cc_dim1 + 1]) + tr11 * (cc[((k + (cc_dim3 << 2)
		) * cc_dim2 + 1) * cc_dim1 + 1] + cc[((k + cc_dim3 * 3) *
		cc_dim2 + 1) * cc_dim1 + 1]);
	ch[((k * 5 + 5) * ch_dim2 + 1) * ch_dim1 + 1] = ti12 * (cc[((k +
		cc_dim3 * 5) * cc_dim2 + 1) * cc_dim1 + 1] - cc[((k + (
		cc_dim3 << 1)) * cc_dim2 + 1) * cc_dim1 + 1]) - ti11 * (cc[((
		k + (cc_dim3 << 2)) * cc_dim2 + 1) * cc_dim1 + 1] - cc[((k +
		cc_dim3 * 3) * cc_dim2 + 1) * cc_dim1 + 1]);
/* L101: */
    }
    if (*ido == 1) {
	return 0;
    }
    idp2 = *ido + 2;
    i__1 = *l1;
    for (k = 1; k <= i__1; ++k) {
	i__2 = *ido;
	for (i__ = 3; i__ <= i__2; i__ += 2) {
	    ic = idp2 - i__;
	    ch[(i__ - 1 + (k * 5 + 1) * ch_dim2) * ch_dim1 + 1] = cc[(i__ - 1
		    + (k + cc_dim3) * cc_dim2) * cc_dim1 + 1] + (wa1[i__ - 2]
		    * cc[(i__ - 1 + (k + (cc_dim3 << 1)) * cc_dim2) * cc_dim1
		    + 1] + wa1[i__ - 1] * cc[(i__ + (k + (cc_dim3 << 1)) *
		    cc_dim2) * cc_dim1 + 1] + (wa4[i__ - 2] * cc[(i__ - 1 + (
		    k + cc_dim3 * 5) * cc_dim2) * cc_dim1 + 1] + wa4[i__ - 1]
		    * cc[(i__ + (k + cc_dim3 * 5) * cc_dim2) * cc_dim1 + 1]))
		    + (wa2[i__ - 2] * cc[(i__ - 1 + (k + cc_dim3 * 3) *
		    cc_dim2) * cc_dim1 + 1] + wa2[i__ - 1] * cc[(i__ + (k +
		    cc_dim3 * 3) * cc_dim2) * cc_dim1 + 1] + (wa3[i__ - 2] *
		    cc[(i__ - 1 + (k + (cc_dim3 << 2)) * cc_dim2) * cc_dim1 +
		    1] + wa3[i__ - 1] * cc[(i__ + (k + (cc_dim3 << 2)) *
		    cc_dim2) * cc_dim1 + 1]));
	    ch[(i__ + (k * 5 + 1) * ch_dim2) * ch_dim1 + 1] = cc[(i__ + (k +
		    cc_dim3) * cc_dim2) * cc_dim1 + 1] + (wa1[i__ - 2] * cc[(
		    i__ + (k + (cc_dim3 << 1)) * cc_dim2) * cc_dim1 + 1] -
		    wa1[i__ - 1] * cc[(i__ - 1 + (k + (cc_dim3 << 1)) *
		    cc_dim2) * cc_dim1 + 1] + (wa4[i__ - 2] * cc[(i__ + (k +
		    cc_dim3 * 5) * cc_dim2) * cc_dim1 + 1] - wa4[i__ - 1] *
		    cc[(i__ - 1 + (k + cc_dim3 * 5) * cc_dim2) * cc_dim1 + 1])
		    ) + (wa2[i__ - 2] * cc[(i__ + (k + cc_dim3 * 3) * cc_dim2)
		     * cc_dim1 + 1] - wa2[i__ - 1] * cc[(i__ - 1 + (k +
		    cc_dim3 * 3) * cc_dim2) * cc_dim1 + 1] + (wa3[i__ - 2] *
		    cc[(i__ + (k + (cc_dim3 << 2)) * cc_dim2) * cc_dim1 + 1]
		    - wa3[i__ - 1] * cc[(i__ - 1 + (k + (cc_dim3 << 2)) *
		    cc_dim2) * cc_dim1 + 1]));
	    ch[(i__ - 1 + (k * 5 + 3) * ch_dim2) * ch_dim1 + 1] = cc[(i__ - 1
		    + (k + cc_dim3) * cc_dim2) * cc_dim1 + 1] + tr11 * (wa1[
		    i__ - 2] * cc[(i__ - 1 + (k + (cc_dim3 << 1)) * cc_dim2) *
		     cc_dim1 + 1] + wa1[i__ - 1] * cc[(i__ + (k + (cc_dim3 <<
		    1)) * cc_dim2) * cc_dim1 + 1] + wa4[i__ - 2] * cc[(i__ -
		    1 + (k + cc_dim3 * 5) * cc_dim2) * cc_dim1 + 1] + wa4[i__
		    - 1] * cc[(i__ + (k + cc_dim3 * 5) * cc_dim2) * cc_dim1 +
		    1]) + tr12 * (wa2[i__ - 2] * cc[(i__ - 1 + (k + cc_dim3 *
		    3) * cc_dim2) * cc_dim1 + 1] + wa2[i__ - 1] * cc[(i__ + (
		    k + cc_dim3 * 3) * cc_dim2) * cc_dim1 + 1] + wa3[i__ - 2]
		    * cc[(i__ - 1 + (k + (cc_dim3 << 2)) * cc_dim2) * cc_dim1
		    + 1] + wa3[i__ - 1] * cc[(i__ + (k + (cc_dim3 << 2)) *
		    cc_dim2) * cc_dim1 + 1]) + ti11 * (wa1[i__ - 2] * cc[(i__
		    + (k + (cc_dim3 << 1)) * cc_dim2) * cc_dim1 + 1] - wa1[
		    i__ - 1] * cc[(i__ - 1 + (k + (cc_dim3 << 1)) * cc_dim2) *
		     cc_dim1 + 1] - (wa4[i__ - 2] * cc[(i__ + (k + cc_dim3 *
		    5) * cc_dim2) * cc_dim1 + 1] - wa4[i__ - 1] * cc[(i__ - 1
		    + (k + cc_dim3 * 5) * cc_dim2) * cc_dim1 + 1])) + ti12 * (
		    wa2[i__ - 2] * cc[(i__ + (k + cc_dim3 * 3) * cc_dim2) *
		    cc_dim1 + 1] - wa2[i__ - 1] * cc[(i__ - 1 + (k + cc_dim3 *
		     3) * cc_dim2) * cc_dim1 + 1] - (wa3[i__ - 2] * cc[(i__ +
		    (k + (cc_dim3 << 2)) * cc_dim2) * cc_dim1 + 1] - wa3[i__
		    - 1] * cc[(i__ - 1 + (k + (cc_dim3 << 2)) * cc_dim2) *
		    cc_dim1 + 1]));
	    ch[(ic - 1 + (k * 5 + 2) * ch_dim2) * ch_dim1 + 1] = cc[(i__ - 1
		    + (k + cc_dim3) * cc_dim2) * cc_dim1 + 1] + tr11 * (wa1[
		    i__ - 2] * cc[(i__ - 1 + (k + (cc_dim3 << 1)) * cc_dim2) *
		     cc_dim1 + 1] + wa1[i__ - 1] * cc[(i__ + (k + (cc_dim3 <<
		    1)) * cc_dim2) * cc_dim1 + 1] + wa4[i__ - 2] * cc[(i__ -
		    1 + (k + cc_dim3 * 5) * cc_dim2) * cc_dim1 + 1] + wa4[i__
		    - 1] * cc[(i__ + (k + cc_dim3 * 5) * cc_dim2) * cc_dim1 +
		    1]) + tr12 * (wa2[i__ - 2] * cc[(i__ - 1 + (k + cc_dim3 *
		    3) * cc_dim2) * cc_dim1 + 1] + wa2[i__ - 1] * cc[(i__ + (
		    k + cc_dim3 * 3) * cc_dim2) * cc_dim1 + 1] + wa3[i__ - 2]
		    * cc[(i__ - 1 + (k + (cc_dim3 << 2)) * cc_dim2) * cc_dim1
		    + 1] + wa3[i__ - 1] * cc[(i__ + (k + (cc_dim3 << 2)) *
		    cc_dim2) * cc_dim1 + 1]) - (ti11 * (wa1[i__ - 2] * cc[(
		    i__ + (k + (cc_dim3 << 1)) * cc_dim2) * cc_dim1 + 1] -
		    wa1[i__ - 1] * cc[(i__ - 1 + (k + (cc_dim3 << 1)) *
		    cc_dim2) * cc_dim1 + 1] - (wa4[i__ - 2] * cc[(i__ + (k +
		    cc_dim3 * 5) * cc_dim2) * cc_dim1 + 1] - wa4[i__ - 1] *
		    cc[(i__ - 1 + (k + cc_dim3 * 5) * cc_dim2) * cc_dim1 + 1])
		    ) + ti12 * (wa2[i__ - 2] * cc[(i__ + (k + cc_dim3 * 3) *
		    cc_dim2) * cc_dim1 + 1] - wa2[i__ - 1] * cc[(i__ - 1 + (k
		    + cc_dim3 * 3) * cc_dim2) * cc_dim1 + 1] - (wa3[i__ - 2] *
		     cc[(i__ + (k + (cc_dim3 << 2)) * cc_dim2) * cc_dim1 + 1]
		    - wa3[i__ - 1] * cc[(i__ - 1 + (k + (cc_dim3 << 2)) *
		    cc_dim2) * cc_dim1 + 1])));
	    ch[(i__ + (k * 5 + 3) * ch_dim2) * ch_dim1 + 1] = cc[(i__ + (k +
		    cc_dim3) * cc_dim2) * cc_dim1 + 1] + tr11 * (wa1[i__ - 2]
		    * cc[(i__ + (k + (cc_dim3 << 1)) * cc_dim2) * cc_dim1 + 1]
		     - wa1[i__ - 1] * cc[(i__ - 1 + (k + (cc_dim3 << 1)) *
		    cc_dim2) * cc_dim1 + 1] + (wa4[i__ - 2] * cc[(i__ + (k +
		    cc_dim3 * 5) * cc_dim2) * cc_dim1 + 1] - wa4[i__ - 1] *
		    cc[(i__ - 1 + (k + cc_dim3 * 5) * cc_dim2) * cc_dim1 + 1])
		    ) + tr12 * (wa2[i__ - 2] * cc[(i__ + (k + cc_dim3 * 3) *
		    cc_dim2) * cc_dim1 + 1] - wa2[i__ - 1] * cc[(i__ - 1 + (k
		    + cc_dim3 * 3) * cc_dim2) * cc_dim1 + 1] + (wa3[i__ - 2] *
		     cc[(i__ + (k + (cc_dim3 << 2)) * cc_dim2) * cc_dim1 + 1]
		    - wa3[i__ - 1] * cc[(i__ - 1 + (k + (cc_dim3 << 2)) *
		    cc_dim2) * cc_dim1 + 1])) + (ti11 * (wa4[i__ - 2] * cc[(
		    i__ - 1 + (k + cc_dim3 * 5) * cc_dim2) * cc_dim1 + 1] +
		    wa4[i__ - 1] * cc[(i__ + (k + cc_dim3 * 5) * cc_dim2) *
		    cc_dim1 + 1] - (wa1[i__ - 2] * cc[(i__ - 1 + (k + (
		    cc_dim3 << 1)) * cc_dim2) * cc_dim1 + 1] + wa1[i__ - 1] *
		    cc[(i__ + (k + (cc_dim3 << 1)) * cc_dim2) * cc_dim1 + 1]))
		     + ti12 * (wa3[i__ - 2] * cc[(i__ - 1 + (k + (cc_dim3 <<
		    2)) * cc_dim2) * cc_dim1 + 1] + wa3[i__ - 1] * cc[(i__ + (
		    k + (cc_dim3 << 2)) * cc_dim2) * cc_dim1 + 1] - (wa2[i__
		    - 2] * cc[(i__ - 1 + (k + cc_dim3 * 3) * cc_dim2) *
		    cc_dim1 + 1] + wa2[i__ - 1] * cc[(i__ + (k + cc_dim3 * 3)
		    * cc_dim2) * cc_dim1 + 1])));
	    ch[(ic + (k * 5 + 2) * ch_dim2) * ch_dim1 + 1] = ti11 * (wa4[i__
		    - 2] * cc[(i__ - 1 + (k + cc_dim3 * 5) * cc_dim2) *
		    cc_dim1 + 1] + wa4[i__ - 1] * cc[(i__ + (k + cc_dim3 * 5)
		    * cc_dim2) * cc_dim1 + 1] - (wa1[i__ - 2] * cc[(i__ - 1 +
		    (k + (cc_dim3 << 1)) * cc_dim2) * cc_dim1 + 1] + wa1[i__
		    - 1] * cc[(i__ + (k + (cc_dim3 << 1)) * cc_dim2) *
		    cc_dim1 + 1])) + ti12 * (wa3[i__ - 2] * cc[(i__ - 1 + (k
		    + (cc_dim3 << 2)) * cc_dim2) * cc_dim1 + 1] + wa3[i__ - 1]
		     * cc[(i__ + (k + (cc_dim3 << 2)) * cc_dim2) * cc_dim1 +
		    1] - (wa2[i__ - 2] * cc[(i__ - 1 + (k + cc_dim3 * 3) *
		    cc_dim2) * cc_dim1 + 1] + wa2[i__ - 1] * cc[(i__ + (k +
		    cc_dim3 * 3) * cc_dim2) * cc_dim1 + 1])) - (cc[(i__ + (k
		    + cc_dim3) * cc_dim2) * cc_dim1 + 1] + tr11 * (wa1[i__ -
		    2] * cc[(i__ + (k + (cc_dim3 << 1)) * cc_dim2) * cc_dim1
		    + 1] - wa1[i__ - 1] * cc[(i__ - 1 + (k + (cc_dim3 << 1)) *
		     cc_dim2) * cc_dim1 + 1] + (wa4[i__ - 2] * cc[(i__ + (k +
		    cc_dim3 * 5) * cc_dim2) * cc_dim1 + 1] - wa4[i__ - 1] *
		    cc[(i__ - 1 + (k + cc_dim3 * 5) * cc_dim2) * cc_dim1 + 1])
		    ) + tr12 * (wa2[i__ - 2] * cc[(i__ + (k + cc_dim3 * 3) *
		    cc_dim2) * cc_dim1 + 1] - wa2[i__ - 1] * cc[(i__ - 1 + (k
		    + cc_dim3 * 3) * cc_dim2) * cc_dim1 + 1] + (wa3[i__ - 2] *
		     cc[(i__ + (k + (cc_dim3 << 2)) * cc_dim2) * cc_dim1 + 1]
		    - wa3[i__ - 1] * cc[(i__ - 1 + (k + (cc_dim3 << 2)) *
		    cc_dim2) * cc_dim1 + 1])));
	    ch[(i__ - 1 + (k * 5 + 5) * ch_dim2) * ch_dim1 + 1] = cc[(i__ - 1
		    + (k + cc_dim3) * cc_dim2) * cc_dim1 + 1] + tr12 * (wa1[
		    i__ - 2] * cc[(i__ - 1 + (k + (cc_dim3 << 1)) * cc_dim2) *
		     cc_dim1 + 1] + wa1[i__ - 1] * cc[(i__ + (k + (cc_dim3 <<
		    1)) * cc_dim2) * cc_dim1 + 1] + (wa4[i__ - 2] * cc[(i__ -
		    1 + (k + cc_dim3 * 5) * cc_dim2) * cc_dim1 + 1] + wa4[i__
		    - 1] * cc[(i__ + (k + cc_dim3 * 5) * cc_dim2) * cc_dim1 +
		    1])) + tr11 * (wa2[i__ - 2] * cc[(i__ - 1 + (k + cc_dim3 *
		     3) * cc_dim2) * cc_dim1 + 1] + wa2[i__ - 1] * cc[(i__ + (
		    k + cc_dim3 * 3) * cc_dim2) * cc_dim1 + 1] + (wa3[i__ - 2]
		     * cc[(i__ - 1 + (k + (cc_dim3 << 2)) * cc_dim2) *
		    cc_dim1 + 1] + wa3[i__ - 1] * cc[(i__ + (k + (cc_dim3 <<
		    2)) * cc_dim2) * cc_dim1 + 1])) + (ti12 * (wa1[i__ - 2] *
		    cc[(i__ + (k + (cc_dim3 << 1)) * cc_dim2) * cc_dim1 + 1]
		    - wa1[i__ - 1] * cc[(i__ - 1 + (k + (cc_dim3 << 1)) *
		    cc_dim2) * cc_dim1 + 1] - (wa4[i__ - 2] * cc[(i__ + (k +
		    cc_dim3 * 5) * cc_dim2) * cc_dim1 + 1] - wa4[i__ - 1] *
		    cc[(i__ - 1 + (k + cc_dim3 * 5) * cc_dim2) * cc_dim1 + 1])
		    ) - ti11 * (wa2[i__ - 2] * cc[(i__ + (k + cc_dim3 * 3) *
		    cc_dim2) * cc_dim1 + 1] - wa2[i__ - 1] * cc[(i__ - 1 + (k
		    + cc_dim3 * 3) * cc_dim2) * cc_dim1 + 1] - (wa3[i__ - 2] *
		     cc[(i__ + (k + (cc_dim3 << 2)) * cc_dim2) * cc_dim1 + 1]
		    - wa3[i__ - 1] * cc[(i__ - 1 + (k + (cc_dim3 << 2)) *
		    cc_dim2) * cc_dim1 + 1])));
	    ch[(ic - 1 + (k * 5 + 4) * ch_dim2) * ch_dim1 + 1] = cc[(i__ - 1
		    + (k + cc_dim3) * cc_dim2) * cc_dim1 + 1] + tr12 * (wa1[
		    i__ - 2] * cc[(i__ - 1 + (k + (cc_dim3 << 1)) * cc_dim2) *
		     cc_dim1 + 1] + wa1[i__ - 1] * cc[(i__ + (k + (cc_dim3 <<
		    1)) * cc_dim2) * cc_dim1 + 1] + (wa4[i__ - 2] * cc[(i__ -
		    1 + (k + cc_dim3 * 5) * cc_dim2) * cc_dim1 + 1] + wa4[i__
		    - 1] * cc[(i__ + (k + cc_dim3 * 5) * cc_dim2) * cc_dim1 +
		    1])) + tr11 * (wa2[i__ - 2] * cc[(i__ - 1 + (k + cc_dim3 *
		     3) * cc_dim2) * cc_dim1 + 1] + wa2[i__ - 1] * cc[(i__ + (
		    k + cc_dim3 * 3) * cc_dim2) * cc_dim1 + 1] + (wa3[i__ - 2]
		     * cc[(i__ - 1 + (k + (cc_dim3 << 2)) * cc_dim2) *
		    cc_dim1 + 1] + wa3[i__ - 1] * cc[(i__ + (k + (cc_dim3 <<
		    2)) * cc_dim2) * cc_dim1 + 1])) - (ti12 * (wa1[i__ - 2] *
		    cc[(i__ + (k + (cc_dim3 << 1)) * cc_dim2) * cc_dim1 + 1]
		    - wa1[i__ - 1] * cc[(i__ - 1 + (k + (cc_dim3 << 1)) *
		    cc_dim2) * cc_dim1 + 1] - (wa4[i__ - 2] * cc[(i__ + (k +
		    cc_dim3 * 5) * cc_dim2) * cc_dim1 + 1] - wa4[i__ - 1] *
		    cc[(i__ - 1 + (k + cc_dim3 * 5) * cc_dim2) * cc_dim1 + 1])
		    ) - ti11 * (wa2[i__ - 2] * cc[(i__ + (k + cc_dim3 * 3) *
		    cc_dim2) * cc_dim1 + 1] - wa2[i__ - 1] * cc[(i__ - 1 + (k
		    + cc_dim3 * 3) * cc_dim2) * cc_dim1 + 1] - (wa3[i__ - 2] *
		     cc[(i__ + (k + (cc_dim3 << 2)) * cc_dim2) * cc_dim1 + 1]
		    - wa3[i__ - 1] * cc[(i__ - 1 + (k + (cc_dim3 << 2)) *
		    cc_dim2) * cc_dim1 + 1])));
	    ch[(i__ + (k * 5 + 5) * ch_dim2) * ch_dim1 + 1] = cc[(i__ + (k +
		    cc_dim3) * cc_dim2) * cc_dim1 + 1] + tr12 * (wa1[i__ - 2]
		    * cc[(i__ + (k + (cc_dim3 << 1)) * cc_dim2) * cc_dim1 + 1]
		     - wa1[i__ - 1] * cc[(i__ - 1 + (k + (cc_dim3 << 1)) *
		    cc_dim2) * cc_dim1 + 1] + (wa4[i__ - 2] * cc[(i__ + (k +
		    cc_dim3 * 5) * cc_dim2) * cc_dim1 + 1] - wa4[i__ - 1] *
		    cc[(i__ - 1 + (k + cc_dim3 * 5) * cc_dim2) * cc_dim1 + 1])
		    ) + tr11 * (wa2[i__ - 2] * cc[(i__ + (k + cc_dim3 * 3) *
		    cc_dim2) * cc_dim1 + 1] - wa2[i__ - 1] * cc[(i__ - 1 + (k
		    + cc_dim3 * 3) * cc_dim2) * cc_dim1 + 1] + (wa3[i__ - 2] *
		     cc[(i__ + (k + (cc_dim3 << 2)) * cc_dim2) * cc_dim1 + 1]
		    - wa3[i__ - 1] * cc[(i__ - 1 + (k + (cc_dim3 << 2)) *
		    cc_dim2) * cc_dim1 + 1])) + (ti12 * (wa4[i__ - 2] * cc[(
		    i__ - 1 + (k + cc_dim3 * 5) * cc_dim2) * cc_dim1 + 1] +
		    wa4[i__ - 1] * cc[(i__ + (k + cc_dim3 * 5) * cc_dim2) *
		    cc_dim1 + 1] - (wa1[i__ - 2] * cc[(i__ - 1 + (k + (
		    cc_dim3 << 1)) * cc_dim2) * cc_dim1 + 1] + wa1[i__ - 1] *
		    cc[(i__ + (k + (cc_dim3 << 1)) * cc_dim2) * cc_dim1 + 1]))
		     - ti11 * (wa3[i__ - 2] * cc[(i__ - 1 + (k + (cc_dim3 <<
		    2)) * cc_dim2) * cc_dim1 + 1] + wa3[i__ - 1] * cc[(i__ + (
		    k + (cc_dim3 << 2)) * cc_dim2) * cc_dim1 + 1] - (wa2[i__
		    - 2] * cc[(i__ - 1 + (k + cc_dim3 * 3) * cc_dim2) *
		    cc_dim1 + 1] + wa2[i__ - 1] * cc[(i__ + (k + cc_dim3 * 3)
		    * cc_dim2) * cc_dim1 + 1])));
	    ch[(ic + (k * 5 + 4) * ch_dim2) * ch_dim1 + 1] = ti12 * (wa4[i__
		    - 2] * cc[(i__ - 1 + (k + cc_dim3 * 5) * cc_dim2) *
		    cc_dim1 + 1] + wa4[i__ - 1] * cc[(i__ + (k + cc_dim3 * 5)
		    * cc_dim2) * cc_dim1 + 1] - (wa1[i__ - 2] * cc[(i__ - 1 +
		    (k + (cc_dim3 << 1)) * cc_dim2) * cc_dim1 + 1] + wa1[i__
		    - 1] * cc[(i__ + (k + (cc_dim3 << 1)) * cc_dim2) *
		    cc_dim1 + 1])) - ti11 * (wa3[i__ - 2] * cc[(i__ - 1 + (k
		    + (cc_dim3 << 2)) * cc_dim2) * cc_dim1 + 1] + wa3[i__ - 1]
		     * cc[(i__ + (k + (cc_dim3 << 2)) * cc_dim2) * cc_dim1 +
		    1] - (wa2[i__ - 2] * cc[(i__ - 1 + (k + cc_dim3 * 3) *
		    cc_dim2) * cc_dim1 + 1] + wa2[i__ - 1] * cc[(i__ + (k +
		    cc_dim3 * 3) * cc_dim2) * cc_dim1 + 1])) - (cc[(i__ + (k
		    + cc_dim3) * cc_dim2) * cc_dim1 + 1] + tr12 * (wa1[i__ -
		    2] * cc[(i__ + (k + (cc_dim3 << 1)) * cc_dim2) * cc_dim1
		    + 1] - wa1[i__ - 1] * cc[(i__ - 1 + (k + (cc_dim3 << 1)) *
		     cc_dim2) * cc_dim1 + 1] + (wa4[i__ - 2] * cc[(i__ + (k +
		    cc_dim3 * 5) * cc_dim2) * cc_dim1 + 1] - wa4[i__ - 1] *
		    cc[(i__ - 1 + (k + cc_dim3 * 5) * cc_dim2) * cc_dim1 + 1])
		    ) + tr11 * (wa2[i__ - 2] * cc[(i__ + (k + cc_dim3 * 3) *
		    cc_dim2) * cc_dim1 + 1] - wa2[i__ - 1] * cc[(i__ - 1 + (k
		    + cc_dim3 * 3) * cc_dim2) * cc_dim1 + 1] + (wa3[i__ - 2] *
		     cc[(i__ + (k + (cc_dim3 << 2)) * cc_dim2) * cc_dim1 + 1]
		    - wa3[i__ - 1] * cc[(i__ - 1 + (k + (cc_dim3 << 2)) *
		    cc_dim2) * cc_dim1 + 1])));
/* L102: */
	}
/* L103: */
    }
    return 0;
}